

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O2

void Omega_h::binary::write_array<signed_char>
               (ostream *stream,Read<signed_char> *array,bool is_compressed,bool needs_swapping)

{
  Alloc *pAVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  uLong dest_bytes;
  HostRead<signed_char> uncompressed;
  Write<signed_char> local_60;
  Read<signed_char> swapped;
  Write<signed_char> local_40;
  
  pAVar1 = (array->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    iVar2 = (int)pAVar1->size;
  }
  else {
    iVar2 = (int)((ulong)pAVar1 >> 3);
  }
  write_value<int>(stream,iVar2,needs_swapping);
  Write<signed_char>::Write(&local_40,&array->write_);
  swap_bytes<signed_char>((binary *)&swapped,(Read<signed_char> *)&local_40,needs_swapping);
  Write<signed_char>::~Write(&local_40);
  Write<signed_char>::Write(&local_60,&swapped.write_);
  HostRead<signed_char>::HostRead(&uncompressed,(Read<signed_char> *)&local_60);
  Write<signed_char>::~Write(&local_60);
  if (is_compressed) {
    dest_bytes = compressBound((long)iVar2);
    pvVar3 = operator_new__(dest_bytes);
    pcVar4 = HostRead<signed_char>::data(&uncompressed);
    pcVar4 = nonnull<signed_char_const>(pcVar4);
    iVar2 = compress2(pvVar3,&dest_bytes,pcVar4,(long)iVar2,1);
    if (iVar2 != 0) {
      fail("assertion %s failed at %s +%d\n","ret == Z_OK",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0x87);
    }
    write_value<long>(stream,dest_bytes,needs_swapping);
    std::ostream::write((char *)stream,(long)pvVar3);
    operator_delete__(pvVar3);
  }
  else {
    pcVar4 = HostRead<signed_char>::data(&uncompressed);
    pcVar4 = nonnull<signed_char_const>(pcVar4);
    std::ostream::write((char *)stream,(long)pcVar4);
  }
  Write<signed_char>::~Write((Write<signed_char> *)&uncompressed);
  Write<signed_char>::~Write(&swapped.write_);
  return;
}

Assistant:

void write_array(std::ostream& stream, Read<T> array, bool is_compressed,
    bool needs_swapping) {
  LO size = array.size();
  write_value(stream, size, needs_swapping);
  Read<T> swapped = swap_bytes(array, needs_swapping);
  HostRead<T> uncompressed(swapped);
  I64 uncompressed_bytes =
      static_cast<I64>(static_cast<std::size_t>(size) * sizeof(T));
#ifdef OMEGA_H_USE_ZLIB
  if (is_compressed) {
    uLong source_bytes = static_cast<uLong>(uncompressed_bytes);
    uLong dest_bytes = ::compressBound(source_bytes);
    auto compressed = new ::Bytef[dest_bytes];
    int ret = ::compress2(compressed, &dest_bytes,
        reinterpret_cast<const ::Bytef*>(nonnull(uncompressed.data())),
        source_bytes, Z_BEST_SPEED);
    OMEGA_H_CHECK(ret == Z_OK);
    I64 compressed_bytes = static_cast<I64>(dest_bytes);
    write_value(stream, compressed_bytes, needs_swapping);
    stream.write(reinterpret_cast<const char*>(compressed), compressed_bytes);
    delete[] compressed;
  } else
#else
  OMEGA_H_CHECK(is_compressed == false);
#endif
  {
    stream.write(reinterpret_cast<const char*>(nonnull(uncompressed.data())),
        uncompressed_bytes);
  }
}